

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclDnsize.c
# Opt level: O1

int Abc_SclCheckOverlap(Abc_Ntk_t *pNtk,Vec_Int_t *vNodes)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  long lVar4;
  
  if (0 < vNodes->nSize) {
    lVar4 = 0;
    do {
      iVar1 = vNodes->pArray[lVar4];
      if (((long)iVar1 < 0) || (pNtk->vObjs->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      plVar2 = (long *)pNtk->vObjs->pArray[iVar1];
      if (plVar2 != (long *)0x0) {
        lVar3 = *plVar2;
        iVar1 = (int)plVar2[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar3 + 0xe0),iVar1 + 1,(int)in_RDX);
        if (((long)iVar1 < 0) || (*(int *)(lVar3 + 0xe4) <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        in_RDX = extraout_RDX;
        if (*(int *)(*(long *)(lVar3 + 0xe8) + (long)iVar1 * 4) == *(int *)(*plVar2 + 0xd8)) {
          return 1;
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < vNodes->nSize);
  }
  return 0;
}

Assistant:

int Abc_SclCheckOverlap( Abc_Ntk_t * pNtk, Vec_Int_t * vNodes )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachObjVec( vNodes, pNtk, pObj, i )
        if ( Abc_NodeIsTravIdCurrent(pObj) )
            return 1;
    return 0;
}